

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# backward_references_cost_enc.c
# Opt level: O0

void PopInterval(CostManager *manager,CostInterval *interval)

{
  int iVar1;
  CostInterval *in_RSI;
  CostManager *in_RDI;
  
  if (in_RSI != (CostInterval *)0x0) {
    ConnectIntervals(in_RDI,in_RSI->previous_,in_RSI->next_);
    iVar1 = CostIntervalIsInFreeList(in_RDI,in_RSI);
    if (iVar1 == 0) {
      in_RSI->next_ = in_RDI->recycled_intervals_;
      in_RDI->recycled_intervals_ = in_RSI;
    }
    else {
      CostIntervalAddToFreeList(in_RDI,in_RSI);
    }
    in_RDI->count_ = in_RDI->count_ + -1;
  }
  return;
}

Assistant:

static WEBP_INLINE void PopInterval(CostManager* const manager,
                                    CostInterval* const interval) {
  if (interval == NULL) return;

  ConnectIntervals(manager, interval->previous_, interval->next_);
  if (CostIntervalIsInFreeList(manager, interval)) {
    CostIntervalAddToFreeList(manager, interval);
  } else {  // recycle regularly malloc'd intervals too
    interval->next_ = manager->recycled_intervals_;
    manager->recycled_intervals_ = interval;
  }
  --manager->count_;
  assert(manager->count_ >= 0);
}